

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
__thiscall
anon_unknown.dwarf_6d004::BuildSystemImpl::createNode
          (BuildSystemImpl *this,StringRef name,bool isImplicit)

{
  char cVar1;
  BuildNode *this_00;
  unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
  extraout_RAX;
  NodeType type;
  
  if (name.Length != 0) {
    cVar1 = name.Data[name.Length - 1];
    if (cVar1 == '/') {
      this_00 = (BuildNode *)operator_new(0x70);
      type = Directory;
      goto LAB_00125c99;
    }
    if (cVar1 == '>' && *name.Data == '<') {
      this_00 = (BuildNode *)operator_new(0x70);
      type = Virtual;
      goto LAB_00125c99;
    }
  }
  this_00 = (BuildNode *)operator_new(0x70);
  type = Plain;
LAB_00125c99:
  llbuild::buildsystem::BuildNode::BuildNode(this_00,name,type);
  this->buildSystem = (BuildSystem *)this_00;
  return (unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
          )extraout_RAX._M_t.
           super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
           .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BuildNode>
BuildSystemImpl::createNode(StringRef name, bool isImplicit) {
  if (name.endswith("/")) {
    return BuildNode::makeDirectory(name);
  }

  if (!name.empty() && name[0] == '<' && name.back() == '>') {
    return BuildNode::makeVirtual(name);
  }

  return BuildNode::makePlain(name);
}